

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall
cppjieba::DictTrie::Shrink
          (DictTrie *this,vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *units)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  allocator_type local_29;
  pointer local_28;
  pointer pDStack_20;
  pointer local_18;
  
  std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>::
  vector<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,void>
            ((vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>> *)&local_28,
             (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
             _M_impl.super__Vector_impl_data._M_finish,&local_29);
  pDVar2 = (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pDVar1 = (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
  super__Vector_impl_data._M_finish = pDStack_20;
  (units->super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = pDVar2;
  pDStack_20 = pDVar3;
  local_18 = pDVar1;
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)&local_28);
  return;
}

Assistant:

void Shrink(vector<DictUnit>& units) const {
    vector<DictUnit>(units.begin(), units.end()).swap(units);
  }